

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

TimeZoneGenericNames * __thiscall
icu_63::TimeZoneFormat::getTimeZoneGenericNames(TimeZoneFormat *this,UErrorCode *status)

{
  UBool UVar1;
  TimeZoneGenericNames *pTVar2;
  TimeZoneFormat *nonConstThis;
  UErrorCode *status_local;
  TimeZoneFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    umtx_lock_63((UMutex *)gLock);
    if (this->fTimeZoneGenericNames == (TimeZoneGenericNames *)0x0) {
      pTVar2 = TimeZoneGenericNames::createInstance(&this->fLocale,status);
      this->fTimeZoneGenericNames = pTVar2;
    }
    umtx_unlock_63((UMutex *)gLock);
    this_local = (TimeZoneFormat *)this->fTimeZoneGenericNames;
  }
  else {
    this_local = (TimeZoneFormat *)0x0;
  }
  return (TimeZoneGenericNames *)this_local;
}

Assistant:

const TimeZoneGenericNames*
TimeZoneFormat::getTimeZoneGenericNames(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return NULL;
    }

    umtx_lock(&gLock);
    if (fTimeZoneGenericNames == NULL) {
        TimeZoneFormat *nonConstThis = const_cast<TimeZoneFormat *>(this);
        nonConstThis->fTimeZoneGenericNames = TimeZoneGenericNames::createInstance(fLocale, status);
    }
    umtx_unlock(&gLock);

    return fTimeZoneGenericNames;
}